

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O2

void __thiscall
duckdb::SingleFileBlockManager::MarkBlockAsFree(SingleFileBlockManager *this,block_id_t block_id)

{
  iterator iVar1;
  InternalException *this_00;
  allocator local_51;
  block_id_t block_id_local;
  string local_48;
  
  block_id_local = block_id;
  ::std::mutex::lock(&this->block_lock);
  iVar1 = ::std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
          ::find(&(this->free_list)._M_t,&block_id_local);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->free_list)._M_t._M_impl.super__Rb_tree_header) {
    ::std::
    _Hashtable<long,_std::pair<const_long,_unsigned_int>,_std::allocator<std::pair<const_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase(&(this->multi_use_blocks)._M_h,&block_id_local);
    ::std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
    _M_insert_unique<long_const&>
              ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
               &this->free_list,&block_id_local);
    ::std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
    _M_insert_unique<long_const&>
              ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
               &this->newly_freed_list,&block_id_local);
    pthread_mutex_unlock((pthread_mutex_t *)&this->block_lock);
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_48,"MarkBlockAsFree called but block %llu was already freed!",
             &local_51);
  InternalException::InternalException<long>(this_00,&local_48,block_id_local);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void SingleFileBlockManager::MarkBlockAsFree(block_id_t block_id) {
	lock_guard<mutex> lock(block_lock);
	D_ASSERT(block_id >= 0);
	D_ASSERT(block_id < max_block);
	if (free_list.find(block_id) != free_list.end()) {
		throw InternalException("MarkBlockAsFree called but block %llu was already freed!", block_id);
	}
	multi_use_blocks.erase(block_id);
	free_list.insert(block_id);
	newly_freed_list.insert(block_id);
}